

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceListTestCase::queryResourceList
          (ResourceListTestCase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dst,GLuint program)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  char *__s;
  size_t sVar4;
  int iVar5;
  GLint maxNameLength;
  GLint numActiveResources;
  GLint written;
  vector<char,_std::allocator<char>_> buffer;
  int local_1e8;
  int local_1e4;
  GLuint local_1e0;
  int local_1dc;
  vector<char,_std::allocator<char>_> local_1d8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  long lVar3;
  
  local_1e0 = program;
  local_1b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dst;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = *(int *)(Functional::(anonymous_namespace)::
                   getProgramInterfaceGLEnum(deqp::gles31::Functional::ProgramInterface)::s_enums +
                  (long)(int)this->m_programInterface * 4);
  local_1e4 = 0;
  local_1e8 = 0;
  local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Querying ",9);
  __s = glu::getProgramInterfaceName(iVar1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8[-3] + (int)(ostringstream *)&local_1a8);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," interface:",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar3 + 0x990))(local_1e0,iVar1,0x92f5,&local_1e4);
  (**(code **)(lVar3 + 0x990))(local_1e0,iVar1,0x92f6,&local_1e8);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"query interface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x3f2);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\tGL_ACTIVE_RESOURCES = ",0x17);
  std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\tGL_MAX_NAME_LENGTH = ",0x16);
  std::ostream::operator<<((ostringstream *)&local_1a8,local_1e8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Querying all active resources",0x1d);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::resize(&local_1d8,(long)(local_1e8 + 1),local_1b0);
  if (0 < local_1e4) {
    iVar5 = 0;
    do {
      local_1dc = 0;
      (**(code **)(lVar3 + 0x9c0))
                (local_1e0,iVar1,iVar5,local_1e8,&local_1dc,
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"query resource name",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x402);
      local_1b0 = (undefined1  [8])local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + local_1dc);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                (local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_1e4);
  }
  if (local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ResourceListTestCase::queryResourceList (std::vector<std::string>& dst, glw::GLuint program)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLenum		programInterface	= getProgramInterfaceGLEnum(m_programInterface);
	glw::GLint				numActiveResources	= 0;
	glw::GLint				maxNameLength		= 0;
	std::vector<char>		buffer;

	m_testCtx.getLog() << tcu::TestLog::Message << "Querying " << glu::getProgramInterfaceName(programInterface) << " interface:" << tcu::TestLog::EndMessage;

	gl.getProgramInterfaceiv(program, programInterface, GL_ACTIVE_RESOURCES, &numActiveResources);
	gl.getProgramInterfaceiv(program, programInterface, GL_MAX_NAME_LENGTH, &maxNameLength);
	GLU_EXPECT_NO_ERROR(gl.getError(), "query interface");

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "\tGL_ACTIVE_RESOURCES = " << numActiveResources << "\n"
						<< "\tGL_MAX_NAME_LENGTH = " << maxNameLength
						<< tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Querying all active resources" << tcu::TestLog::EndMessage;

	buffer.resize(maxNameLength+1, '\0');

	for (int resourceNdx = 0; resourceNdx < numActiveResources; ++resourceNdx)
	{
		glw::GLint written = 0;

		gl.getProgramResourceName(program, programInterface, resourceNdx, maxNameLength, &written, &buffer[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource name");

		dst.push_back(std::string(&buffer[0], written));
	}
}